

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat_extra.hpp
# Opt level: O2

mat3x2f * operator*(mat3x2f *__return_storage_ptr__,mat3x2f *a,mat2f *b)

{
  int i;
  long lVar1;
  float *pfVar2;
  int j;
  long lVar3;
  int k;
  long lVar4;
  float fVar5;
  
  __return_storage_ptr__->data[0] = (float  [2])0x0;
  __return_storage_ptr__->data[1] = (float  [2])0x0;
  __return_storage_ptr__->data[2] = (float  [2])0x0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    pfVar2 = (float *)b;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      fVar5 = __return_storage_ptr__->data[lVar1][lVar3];
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        fVar5 = fVar5 + (*(float (*) [2])*(float (*) [2])a)[lVar4] * pfVar2[lVar4 * 2];
      }
      __return_storage_ptr__->data[lVar1][lVar3] = fVar5;
      pfVar2 = pfVar2 + 1;
    }
    a = (mat3x2f *)((long)a + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline mat3x2f operator * (const mat3x2f& a, const mat2f& b)
{
	mat3x2f res;
	for (int i=0; i<3; ++i)
		for (int j=0; j<2; ++j)
			for (int k=0; k<2; ++k)
				res[i][j] += a[i][k] * b[k][j];
	return res;
}